

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int updatewindow(z_streamp strm,Bytef *end,uint copy)

{
  internal_state *piVar1;
  uint uVar2;
  voidpf pvVar3;
  uint local_34;
  uint dist;
  inflate_state *state;
  uint copy_local;
  Bytef *end_local;
  z_streamp strm_local;
  
  piVar1 = strm->state;
  if (*(long *)(piVar1 + 0x48) == 0) {
    pvVar3 = (*strm->zalloc)(strm->opaque,1 << ((byte)*(undefined4 *)(piVar1 + 0x38) & 0x1f),1);
    *(voidpf *)(piVar1 + 0x48) = pvVar3;
    if (*(long *)(piVar1 + 0x48) == 0) {
      return 1;
    }
  }
  if (*(int *)(piVar1 + 0x3c) == 0) {
    *(int *)(piVar1 + 0x3c) = 1 << ((byte)*(undefined4 *)(piVar1 + 0x38) & 0x1f);
    *(undefined4 *)(piVar1 + 0x44) = 0;
    *(undefined4 *)(piVar1 + 0x40) = 0;
  }
  if (copy < *(uint *)(piVar1 + 0x3c)) {
    local_34 = *(int *)(piVar1 + 0x3c) - *(int *)(piVar1 + 0x44);
    if (copy < local_34) {
      local_34 = copy;
    }
    memcpy((void *)(*(long *)(piVar1 + 0x48) + (ulong)*(uint *)(piVar1 + 0x44)),end + -(ulong)copy,
           (ulong)local_34);
    uVar2 = copy - local_34;
    if (uVar2 == 0) {
      *(uint *)(piVar1 + 0x44) = local_34 + *(int *)(piVar1 + 0x44);
      if (*(int *)(piVar1 + 0x44) == *(int *)(piVar1 + 0x3c)) {
        *(undefined4 *)(piVar1 + 0x44) = 0;
      }
      if (*(uint *)(piVar1 + 0x40) < *(uint *)(piVar1 + 0x3c)) {
        *(uint *)(piVar1 + 0x40) = local_34 + *(int *)(piVar1 + 0x40);
      }
    }
    else {
      memcpy(*(void **)(piVar1 + 0x48),end + -(ulong)uVar2,(ulong)uVar2);
      *(uint *)(piVar1 + 0x44) = uVar2;
      *(undefined4 *)(piVar1 + 0x40) = *(undefined4 *)(piVar1 + 0x3c);
    }
  }
  else {
    memcpy(*(void **)(piVar1 + 0x48),end + -(ulong)*(uint *)(piVar1 + 0x3c),
           (ulong)*(uint *)(piVar1 + 0x3c));
    *(undefined4 *)(piVar1 + 0x44) = 0;
    *(undefined4 *)(piVar1 + 0x40) = *(undefined4 *)(piVar1 + 0x3c);
  }
  return 0;
}

Assistant:

local int updatewindow(z_streamp strm, const Bytef *end, unsigned copy) {
    struct inflate_state FAR *state;
    unsigned dist;

    state = (struct inflate_state FAR *)strm->state;

    /* if it hasn't been done already, allocate space for the window */
    if (state->window == Z_NULL) {
        state->window = (unsigned char FAR *)
                        ZALLOC(strm, 1U << state->wbits,
                               sizeof(unsigned char));
        if (state->window == Z_NULL) return 1;
    }

    /* if window not in use yet, initialize */
    if (state->wsize == 0) {
        state->wsize = 1U << state->wbits;
        state->wnext = 0;
        state->whave = 0;
    }

    /* copy state->wsize or less output bytes into the circular window */
    if (copy >= state->wsize) {
        zmemcpy(state->window, end - state->wsize, state->wsize);
        state->wnext = 0;
        state->whave = state->wsize;
    }
    else {
        dist = state->wsize - state->wnext;
        if (dist > copy) dist = copy;
        zmemcpy(state->window + state->wnext, end - copy, dist);
        copy -= dist;
        if (copy) {
            zmemcpy(state->window, end - copy, copy);
            state->wnext = copy;
            state->whave = state->wsize;
        }
        else {
            state->wnext += dist;
            if (state->wnext == state->wsize) state->wnext = 0;
            if (state->whave < state->wsize) state->whave += dist;
        }
    }
    return 0;
}